

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::draw_rectangle
          (CImg<unsigned_char> *this,int x0,int y0,int z0,int c0,int x1,int y1,int z1,int c1,
          uchar val,float opacity)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int __x;
  CImg<unsigned_char> *pCVar5;
  float extraout_XMM0_Da;
  type tVar6;
  uint local_13c;
  uint local_134;
  uint local_12c;
  uint local_124;
  int local_120;
  int local_118;
  int local_10c;
  int local_104;
  int local_f8;
  int local_f0;
  int local_e4;
  int local_dc;
  float local_d0;
  float local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_a8;
  int local_a4;
  int x;
  int y;
  int z;
  int v;
  uchar *ptrd;
  float local_88;
  float local_84;
  float copacity;
  float nopacity;
  unsigned_long offZ;
  unsigned_long offY;
  unsigned_long offX;
  int local_60;
  int lC;
  int lZ;
  int lY;
  int lX;
  int nc1;
  int nc0;
  int nz1;
  int nz0;
  int ny1;
  int ny0;
  int nx1;
  int nx0;
  bool bc;
  bool bz;
  bool by;
  bool bx;
  float opacity_local;
  int x1_local;
  int c0_local;
  int z0_local;
  int y0_local;
  int x0_local;
  CImg<unsigned_char> *this_local;
  
  nx0 = (int)opacity;
  _bc = x1;
  opacity_local = (float)c0;
  x1_local = z0;
  c0_local = y0;
  z0_local = x0;
  _y0_local = this;
  bVar1 = is_empty(this);
  if (!bVar1) {
    nx1._3_1_ = z0_local < _bc;
    nx1._2_1_ = c0_local < y1;
    nx1._1_1_ = x1_local < z1;
    nx1._0_1_ = (int)opacity_local < c1;
    if ((bool)nx1._3_1_) {
      local_b4 = z0_local;
    }
    else {
      local_b4 = _bc;
    }
    ny0 = local_b4;
    if ((bool)nx1._3_1_) {
      local_b8 = _bc;
    }
    else {
      local_b8 = z0_local;
    }
    ny1 = local_b8;
    if ((bool)nx1._2_1_) {
      local_bc = c0_local;
    }
    else {
      local_bc = y1;
    }
    nz0 = local_bc;
    if ((bool)nx1._2_1_) {
      local_c0 = y1;
    }
    else {
      local_c0 = c0_local;
    }
    nz1 = local_c0;
    if ((bool)nx1._1_1_) {
      local_c4 = x1_local;
    }
    else {
      local_c4 = z1;
    }
    nc0 = local_c4;
    if ((bool)nx1._1_1_) {
      local_c8 = z1;
    }
    else {
      local_c8 = x1_local;
    }
    nc1 = local_c8;
    if ((bool)(undefined1)nx1) {
      local_cc = opacity_local;
    }
    else {
      local_cc = (float)c1;
    }
    lX = (int)local_cc;
    if ((bool)(undefined1)nx1) {
      local_d0 = (float)c1;
    }
    else {
      local_d0 = opacity_local;
    }
    lY = (int)local_d0;
    iVar2 = width(this);
    if (local_b8 < iVar2) {
      local_dc = 0;
    }
    else {
      iVar2 = width(this);
      local_dc = (iVar2 + -1) - ny1;
    }
    iVar2 = nz1;
    if (ny0 < 0) {
      local_e4 = ny0;
    }
    else {
      local_e4 = 0;
    }
    lZ = ((local_b8 + 1) - local_b4) + local_dc + local_e4;
    iVar3 = (nz1 + 1) - nz0;
    iVar4 = height(this);
    if (iVar2 < iVar4) {
      local_f0 = 0;
    }
    else {
      iVar2 = height(this);
      local_f0 = (iVar2 + -1) - nz1;
    }
    iVar2 = nc1;
    if (nz0 < 0) {
      local_f8 = nz0;
    }
    else {
      local_f8 = 0;
    }
    lC = iVar3 + local_f0 + local_f8;
    iVar3 = (nc1 + 1) - nc0;
    iVar4 = depth(this);
    if (iVar2 < iVar4) {
      local_104 = 0;
    }
    else {
      iVar2 = depth(this);
      local_104 = (iVar2 + -1) - nc1;
    }
    iVar2 = lY;
    if (nc0 < 0) {
      local_10c = nc0;
    }
    else {
      local_10c = 0;
    }
    local_60 = iVar3 + local_104 + local_10c;
    iVar3 = (lY + 1) - lX;
    pCVar5 = this;
    iVar4 = spectrum(this);
    __x = (int)pCVar5;
    if (iVar2 < iVar4) {
      local_118 = 0;
    }
    else {
      pCVar5 = this;
      iVar2 = spectrum(this);
      __x = (int)pCVar5;
      local_118 = (iVar2 + -1) - lY;
    }
    if (lX < 0) {
      local_120 = lX;
    }
    else {
      local_120 = 0;
    }
    offX._4_4_ = iVar3 + local_118 + local_120;
    offY = (ulong)this->_width - (long)lZ;
    offZ = (ulong)this->_width * (ulong)(this->_height - lC);
    _copacity = (ulong)this->_width * (ulong)this->_height * (ulong)(this->_depth - local_60);
    cimg::abs(__x);
    ptrd._4_4_ = 0;
    local_84 = extraout_XMM0_Da;
    tVar6 = cimg::max<float,int>((float *)&nx0,(int *)((long)&ptrd + 4));
    local_88 = 1.0 - tVar6;
    if (ny0 < 0) {
      local_124 = 0;
    }
    else {
      local_124 = ny0;
    }
    if (nz0 < 0) {
      local_12c = 0;
    }
    else {
      local_12c = nz0;
    }
    if (nc0 < 0) {
      local_134 = 0;
    }
    else {
      local_134 = nc0;
    }
    if (lX < 0) {
      local_13c = 0;
    }
    else {
      local_13c = lX;
    }
    _z = data(this,local_124,local_12c,local_134,local_13c);
    if ((((0 < lZ) && (0 < lC)) && (0 < local_60)) && (0 < offX._4_4_)) {
      for (y = 0; y < offX._4_4_; y = y + 1) {
        for (x = 0; x < local_60; x = x + 1) {
          for (local_a4 = 0; local_a4 < lC; local_a4 = local_a4 + 1) {
            if ((float)nx0 < 1.0) {
              for (local_a8 = 0; local_a8 < lZ; local_a8 = local_a8 + 1) {
                *_z = (byte)(int)(local_84 * (float)val + (float)*_z * local_88);
                _z = _z + 1;
              }
              _z = _z + offY;
            }
            else {
              memset(_z,(uint)val,(long)lZ);
              _z = _z + this->_width;
            }
          }
          _z = _z + offZ;
        }
        _z = _z + _copacity;
      }
    }
  }
  return this;
}

Assistant:

CImg<T>& draw_rectangle(const int x0, const int y0, const int z0, const int c0,
                            const int x1, const int y1, const int z1, const int c1,
                            const T val, const float opacity=1) {
      if (is_empty()) return *this;
      const bool bx = (x0<x1), by = (y0<y1), bz = (z0<z1), bc = (c0<c1);
      const int
        nx0 = bx?x0:x1, nx1 = bx?x1:x0,
        ny0 = by?y0:y1, ny1 = by?y1:y0,
        nz0 = bz?z0:z1, nz1 = bz?z1:z0,
        nc0 = bc?c0:c1, nc1 = bc?c1:c0;
      const int
        lX = (1 + nx1 - nx0) + (nx1>=width()?width() - 1 - nx1:0) + (nx0<0?nx0:0),
        lY = (1 + ny1 - ny0) + (ny1>=height()?height() - 1 - ny1:0) + (ny0<0?ny0:0),
        lZ = (1 + nz1 - nz0) + (nz1>=depth()?depth() - 1 - nz1:0) + (nz0<0?nz0:0),
        lC = (1 + nc1 - nc0) + (nc1>=spectrum()?spectrum() - 1 - nc1:0) + (nc0<0?nc0:0);
      const unsigned long
        offX = (unsigned long)_width - lX,
        offY = (unsigned long)_width*(_height - lY),
        offZ = (unsigned long)_width*_height*(_depth - lZ);
      const float nopacity = cimg::abs(opacity), copacity = 1 - cimg::max(opacity,0);
      T *ptrd = data(nx0<0?0:nx0,ny0<0?0:ny0,nz0<0?0:nz0,nc0<0?0:nc0);
      if (lX>0 && lY>0 && lZ>0 && lC>0)
        for (int v = 0; v<lC; ++v) {
          for (int z = 0; z<lZ; ++z) {
            for (int y = 0; y<lY; ++y) {
              if (opacity>=1) {
                if (sizeof(T)!=1) { for (int x = 0; x<lX; ++x) *(ptrd++) = val; ptrd+=offX; }
                else { std::memset(ptrd,(int)val,lX); ptrd+=_width; }
              } else { for (int x = 0; x<lX; ++x) { *ptrd = (T)(nopacity*val + *ptrd*copacity); ++ptrd; } ptrd+=offX; }
            }
            ptrd+=offY;
          }
          ptrd+=offZ;
        }
      return *this;
    }